

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

void Abc_NtkHaigResetReprsOld(Hop_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *vClasses;
  Vec_Ptr_t *vMembers;
  Hop_Man_t *pMan_local;
  
  p = Abc_NtkHaigCollectMembers(pMan);
  uVar1 = Vec_PtrSize(p);
  printf("Collected %6d class members.\n",(ulong)uVar1);
  p_00 = Abc_NtkHaigCreateClasses(p);
  uVar1 = Vec_PtrSize(p_00);
  iVar2 = Vec_PtrSize(p);
  iVar3 = Vec_PtrSize(p_00);
  printf("Collected %6d classes. (Ave = %5.2f)\n",(double)((float)iVar2 / (float)iVar3),(ulong)uVar1
        );
  Vec_PtrFree(p);
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Abc_NtkHaigResetReprsOld( Hop_Man_t * pMan )
{
    Vec_Ptr_t * vMembers, * vClasses;

    // collect members of the classes and make them point to reprs
    vMembers = Abc_NtkHaigCollectMembers( pMan );
    printf( "Collected %6d class members.\n", Vec_PtrSize(vMembers) );

    // create classes
    vClasses = Abc_NtkHaigCreateClasses( vMembers );
    printf( "Collected %6d classes. (Ave = %5.2f)\n", Vec_PtrSize(vClasses), 
        (float)(Vec_PtrSize(vMembers))/Vec_PtrSize(vClasses) );

    Vec_PtrFree( vMembers );
    Vec_PtrFree( vClasses );
}